

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

void __thiscall Rml::BaseXMLParser::ReadHeader(BaseXMLParser *this)

{
  bool bVar1;
  undefined1 local_30 [8];
  String temp;
  BaseXMLParser *this_local;
  
  temp.field_2._8_8_ = this;
  bVar1 = PeekString(this,"<?",true);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)local_30);
    FindString(this,">",(String *)local_30,false);
    ::std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void BaseXMLParser::ReadHeader()
{
	if (PeekString("<?"))
	{
		String temp;
		FindString(">", temp);
	}
}